

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

bool __thiscall
fmt::v8::detail::
write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128,char16_t>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> *out,
          unsigned___int128 value,uint prefix,basic_format_specs<char16_t> *specs,locale_ref loc)

{
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar1;
  locale_ref in_R9;
  digit_grouping<char16_t> grouping;
  
  digit_grouping<char16_t>::digit_grouping(&grouping,in_R9,true);
  bVar1 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned__int128,char16_t>
                    (*(detail **)this,(back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out,
                     grouping.sep_.grouping._0_16_,prefix,
                     (basic_format_specs<char16_t> *)((ulong)specs & 0xffffffff),
                     (digit_grouping<char16_t> *)loc.locale_);
  *(buffer<char16_t> **)this = bVar1.container;
  std::__cxx11::string::~string((string *)&grouping);
  return true;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  auto grouping = digit_grouping<Char>(loc);
  out = write_int_localized(out, value, prefix, specs, grouping);
  return true;
}